

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void rapidjson::SkipWhitespace<rapidjson::BasicIStreamWrapper<std::istream>>
               (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  while (((ulong)(byte)*is->current_ < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)*is->current_ & 0x3f) & 1) != 0))) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
  }
  return;
}

Assistant:

void SkipWhitespace(InputStream& is) {
    internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    typename InputStream::Ch c;
    while ((c = s.Peek()) == ' ' || c == '\n' || c == '\r' || c == '\t')
        s.Take();
}